

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

int colamd(int n_row,int n_col,int Alen,int *A,int *p,double *knobs,int *stats)

{
  int iVar1;
  size_t sVar2;
  int local_130;
  uint local_12c;
  int ok;
  int aggressive;
  double default_knobs [20];
  int local_80;
  int local_7c;
  int max_deg;
  int ngarbage;
  int n_row2;
  int n_col2;
  Colamd_Col *Col;
  Colamd_Row *Row;
  size_t need;
  size_t Col_size;
  size_t Row_size;
  int nnz;
  int i;
  double *knobs_local;
  int *p_local;
  int *A_local;
  int Alen_local;
  int n_col_local;
  int n_row_local;
  
  if (stats == (int *)0x0) {
    n_col_local = 0;
  }
  else {
    for (Row_size._4_4_ = 0; Row_size._4_4_ < 0x14; Row_size._4_4_ = Row_size._4_4_ + 1) {
      stats[Row_size._4_4_] = 0;
    }
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
      n_col_local = 0;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
      n_col_local = 0;
    }
    else if (n_row < 0) {
      stats[3] = -3;
      stats[4] = n_row;
      n_col_local = 0;
    }
    else if (n_col < 0) {
      stats[3] = -4;
      stats[4] = n_col;
      n_col_local = 0;
    }
    else {
      Row_size._0_4_ = p[n_col];
      if ((int)Row_size < 0) {
        stats[3] = -5;
        stats[4] = (int)Row_size;
        n_col_local = 0;
      }
      else if (*p == 0) {
        _nnz = knobs;
        knobs_local = (double *)p;
        p_local = A;
        A_local._0_4_ = Alen;
        A_local._4_4_ = n_col;
        Alen_local = n_row;
        if (knobs == (double *)0x0) {
          colamd_set_defaults((double *)&ok);
          _nnz = (double *)&ok;
        }
        local_12c = (uint)(_nnz[2] != 0.0);
        local_130 = 1;
        sVar2 = t_add((long)A_local._4_4_,1,&local_130);
        sVar2 = t_mult(sVar2,0x18,&local_130);
        need = sVar2 >> 2;
        sVar2 = t_add((long)Alen_local,1,&local_130);
        sVar2 = t_mult(sVar2,0x10,&local_130);
        Col_size = sVar2 >> 2;
        Row = (Colamd_Row *)t_mult((long)(int)Row_size,2,&local_130);
        Row = (Colamd_Row *)t_add((size_t)Row,(long)A_local._4_4_,&local_130);
        Row = (Colamd_Row *)t_add((size_t)Row,need,&local_130);
        Row = (Colamd_Row *)t_add((size_t)Row,Col_size,&local_130);
        if (((local_130 == 0) || ((Colamd_Row *)(long)(int)A_local < Row)) ||
           ((Colamd_Row *)0x7fffffff < Row)) {
          stats[3] = -7;
          stats[4] = (int)Row;
          stats[5] = (int)A_local;
          n_col_local = 0;
        }
        else {
          A_local._0_4_ = (int)A_local - ((int)need + (int)Col_size);
          _n_row2 = (Colamd_Col *)(p_local + (int)A_local);
          Col = (Colamd_Col *)(p_local + (long)(int)A_local + need);
          iVar1 = init_rows_cols(Alen_local,A_local._4_4_,(Colamd_Row *)Col,_n_row2,p_local,
                                 (int *)knobs_local,stats);
          if (iVar1 == 0) {
            n_col_local = 0;
          }
          else {
            init_scoring(Alen_local,A_local._4_4_,(Colamd_Row *)Col,_n_row2,p_local,
                         (int *)knobs_local,_nnz,&max_deg,&ngarbage,&local_80);
            local_7c = find_ordering(Alen_local,A_local._4_4_,(int)A_local,(Colamd_Row *)Col,_n_row2
                                     ,p_local,(int *)knobs_local,ngarbage,local_80,
                                     (int)Row_size << 1,local_12c);
            order_children(A_local._4_4_,_n_row2,(int *)knobs_local);
            *stats = Alen_local - max_deg;
            stats[1] = A_local._4_4_ - ngarbage;
            stats[2] = local_7c;
            n_col_local = 1;
          }
        }
      }
      else {
        stats[3] = -6;
        stats[4] = *p;
        n_col_local = 0;
      }
    }
  }
  return n_col_local;
}

Assistant:

PUBLIC Int COLAMD_MAIN		/* returns TRUE if successful, FALSE otherwise*/
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows in A */
    Int n_col,			/* number of columns in A */
    Int Alen,			/* length of A */
    Int A [],			/* row indices of A */
    Int p [],			/* pointers to columns in A */
    double knobs [COLAMD_KNOBS],/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS]	/* output statistics and error codes */
)
{
    /* === Local variables ================================================== */

    Int i ;			/* loop index */
    Int nnz ;			/* nonzeros in A */
    size_t Row_size ;		/* size of Row [], in integers */
    size_t Col_size ;		/* size of Col [], in integers */
    size_t need ;		/* minimum required length of A */
    Colamd_Row *Row ;		/* pointer into A of Row [0..n_row] array */
    Colamd_Col *Col ;		/* pointer into A of Col [0..n_col] array */
    Int n_col2 ;		/* number of non-dense, non-empty columns */
    Int n_row2 ;		/* number of non-dense, non-empty rows */
    Int ngarbage ;		/* number of garbage collections performed */
    Int max_deg ;		/* maximum row degree */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs array */
    Int aggressive ;		/* do aggressive absorption */
    int ok ;

#ifndef NDEBUG
    colamd_get_debug ("colamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("colamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)		/* A is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("colamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("colamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n_row < 0)	/* n_row must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nrow_negative ;
	stats [COLAMD_INFO1] = n_row ;
	DEBUG0 (("colamd: nrow negative %d\n", n_row)) ;
    	return (FALSE) ;
    }

    if (n_col < 0)	/* n_col must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n_col ;
	DEBUG0 (("colamd: ncol negative %d\n", n_col)) ;
    	return (FALSE) ;
    }

    nnz = p [n_col] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("colamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero	;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("colamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    aggressive = (knobs [COLAMD_AGGRESSIVE] != FALSE) ;

    /* === Allocate the Row and Col arrays from array A ===================== */

    ok = TRUE ;
    Col_size = COLAMD_C (n_col, &ok) ;	    /* size of Col array of structs */
    Row_size = COLAMD_R (n_row, &ok) ;	    /* size of Row array of structs */

    /* need = 2*nnz + n_col + Col_size + Row_size ; */
    need = t_mult (nnz, 2, &ok) ;
    need = t_add (need, n_col, &ok) ;
    need = t_add (need, Col_size, &ok) ;
    need = t_add (need, Row_size, &ok) ;

    if (!ok || need > (size_t) Alen || need > Int_MAX)
    {
	/* not enough space in array A to perform the ordering */
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_too_small ;
	stats [COLAMD_INFO1] = need ;
	stats [COLAMD_INFO2] = Alen ;
	DEBUG0 (("colamd: Need Alen >= %d, given only Alen = %d\n", need,Alen));
	return (FALSE) ;
    }

    Alen -= Col_size + Row_size ;
    Col = (Colamd_Col *) &A [Alen] ;
    Row = (Colamd_Row *) &A [Alen + Col_size] ;

    /* === Construct the row and column data structures ===================== */

    if (!init_rows_cols (n_row, n_col, Row, Col, A, p, stats))
    {
	/* input matrix is invalid */
	DEBUG0 (("colamd: Matrix invalid\n")) ;
	return (FALSE) ;
    }

    /* === Initialize scores, kill dense rows/columns ======================= */

    init_scoring (n_row, n_col, Row, Col, A, p, knobs,
	&n_row2, &n_col2, &max_deg) ;

    /* === Order the supercolumns =========================================== */

    ngarbage = find_ordering (n_row, n_col, Alen, Row, Col, A, p,
	n_col2, max_deg, 2*nnz, aggressive) ;

    /* === Order the non-principal columns ================================== */

    order_children (n_col, Col, p) ;

    /* === Return statistics in stats ======================================= */

    stats [COLAMD_DENSE_ROW] = n_row - n_row2 ;
    stats [COLAMD_DENSE_COL] = n_col - n_col2 ;
    stats [COLAMD_DEFRAG_COUNT] = ngarbage ;
    DEBUG0 (("colamd: done.\n")) ; 
    return (TRUE) ;
}